

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

int inv_weight(void)

{
  uint uVar1;
  obj **ppoVar2;
  xchar xVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  obj *poVar8;
  
  iVar5 = 0;
  poVar8 = invent;
  if (invent != (obj *)0x0) {
    do {
      if (poVar8->oclass == '\f') {
        uVar4 = SUB168(SEXT816((long)poVar8->quan + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) +
                (long)poVar8->quan + 0x32;
        iVar5 = iVar5 + ((int)(uVar4 >> 6) - (int)((long)uVar4 >> 0x3f));
      }
      else if ((poVar8->otyp != 0x214) || (((youmonst.data)->mflags2 & 0x8000000) == 0)) {
        uVar1 = poVar8->owt;
        if ((poVar8 == uarm) &&
           (iVar6 = uVar1 - objects[0x77].oc_weight, objects[0x77].oc_weight <= uVar1 && iVar6 != 0)
           ) {
          xVar3 = mon_skill_level(0x28,&youmonst);
          if ('\x01' < xVar3) {
            if (xVar3 == '\x03') {
              iVar6 = iVar6 / 2;
            }
            else if (xVar3 == '\x02') {
              iVar7 = iVar6 * 3 + 3;
              if (-1 < iVar6 * 3) {
                iVar7 = iVar6 * 3;
              }
              iVar6 = iVar7 >> 2;
            }
            else {
              iVar7 = iVar6 + 3;
              if (-1 < iVar6) {
                iVar7 = iVar6;
              }
              iVar6 = iVar7 >> 2;
            }
          }
          iVar5 = iVar5 + (uint)objects[0x77].oc_weight + iVar6;
        }
        else {
          iVar5 = iVar5 + uVar1;
        }
      }
      ppoVar2 = &poVar8->nobj;
      poVar8 = *ppoVar2;
    } while (*ppoVar2 != (obj *)0x0);
  }
  wc = weight_cap();
  return iVar5 - wc;
}

Assistant:

int inv_weight(void)
{
	struct obj *otmp = invent;
	int wt = 0;

	while (otmp) {
	    if (otmp->oclass == COIN_CLASS) {
		wt += (int)(((long)otmp->quan + 50L) / 100L);
	    } else if (otmp->otyp != BOULDER || !throws_rocks(youmonst.data)) {
		if (otmp == uarm && otmp->owt > P_BODY_ARMOR_MIN_WEIGHT) {
		    /*
		     * Reduce weight of worn body armor based on skill and
		     * weight difference from leather armor:
		     *
		     *  - unskilled -> no reduction
		     *  - basic     -> 25% reduction
		     *  - skilled   -> 50% reduction
		     *  - expert    -> 75% reduction
		     *
		     * e.g. Wearing plate mail {450} at expert only weighs {225}.
		     */
		    int wt_diff = otmp->owt - P_BODY_ARMOR_MIN_WEIGHT;
		    int ba_skill = mon_skill_level(P_BODY_ARMOR, &youmonst);
		    wt += P_BODY_ARMOR_MIN_WEIGHT;
		    if (ba_skill <= P_UNSKILLED)
			wt += wt_diff;
		    else if (ba_skill == P_BASIC)
			wt += wt_diff * 3 / 4;
		    else if (ba_skill == P_SKILLED)
			wt += wt_diff / 2;
		    else if (ba_skill >= P_EXPERT)
			wt += wt_diff / 4;
		} else {
		    wt += otmp->owt;
		}
	    }
	    otmp = otmp->nobj;
	}
	wc = weight_cap();
	return wt - wc;
}